

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O0

void __thiscall duckdb::ColumnList::AddToNameMap(ColumnList *this,ColumnDefinition *col)

{
  column_t cVar1;
  bool bVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  __lhs;
  undefined8 uVar4;
  column_t *pcVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  mapped_type *pmVar6;
  ColumnDefinition *in_RSI;
  long in_RDI;
  string base_name;
  idx_t index;
  key_type *in_stack_fffffffffffffe98;
  ColumnDefinition *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffec0;
  string local_110 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  CatalogException *in_stack_ffffffffffffff10;
  string local_e8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_c0;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_58 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_40;
  string local_38 [32];
  long local_18;
  ColumnDefinition *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
    ColumnDefinition::Name_abi_cxx11_(in_RSI);
    local_c0._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffe98,(key_type *)0x22e601);
    local_c8._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)in_stack_fffffffffffffe98);
    bVar2 = ::std::__detail::operator!=(&local_c0,&local_c8);
    if (bVar2) {
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_e8,"Column with name %s already exists!",
                 (allocator *)&stack0xffffffffffffff17);
      psVar3 = ColumnDefinition::Name_abi_cxx11_(local_10);
      ::std::__cxx11::string::string(local_110,(string *)psVar3);
      CatalogException::CatalogException<std::__cxx11::string>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      __cxa_throw(uVar4,&CatalogException::typeinfo,CatalogException::~CatalogException);
    }
  }
  else {
    local_18 = 1;
    psVar3 = ColumnDefinition::Name_abi_cxx11_(in_RSI);
    ::std::__cxx11::string::string(local_38,(string *)psVar3);
    while( true ) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x18);
      ColumnDefinition::Name_abi_cxx11_(local_10);
      __lhs._M_cur = (__node_type *)
                     ::std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)in_stack_fffffffffffffe98,(key_type *)0x22e43f);
      local_40._M_cur = __lhs._M_cur;
      local_58[0]._M_cur =
           (__node_type *)
           ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffe98);
      bVar2 = ::std::__detail::operator!=(&local_40,local_58);
      if (!bVar2) break;
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10
                       ,in_stack_fffffffffffffec0);
      local_18 = local_18 + 1;
      ::std::__cxx11::to_string((unsigned_long)__lhs._M_cur);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __lhs._M_cur,__rhs);
      ColumnDefinition::SetName(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      ::std::__cxx11::string::~string(local_78);
      ::std::__cxx11::string::~string(local_b8);
      ::std::__cxx11::string::~string(local_98);
    }
    ::std::__cxx11::string::~string(local_38);
  }
  pcVar5 = ColumnDefinition::Oid(local_10);
  cVar1 = *pcVar5;
  this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             *)(in_RDI + 0x18);
  ColumnDefinition::Name_abi_cxx11_(local_10);
  pmVar6 = ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,in_stack_fffffffffffffe98);
  *pmVar6 = cVar1;
  return;
}

Assistant:

void ColumnList::AddToNameMap(ColumnDefinition &col) {
	if (allow_duplicate_names) {
		idx_t index = 1;
		string base_name = col.Name();
		while (name_map.find(col.Name()) != name_map.end()) {
			col.SetName(base_name + "_" + to_string(index++));
		}
	} else {
		if (name_map.find(col.Name()) != name_map.end()) {
			throw CatalogException("Column with name %s already exists!", col.Name());
		}
	}
	name_map[col.Name()] = col.Oid();
}